

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

Vec_Ptr_t * Ssw_SmlSimDataPointers(Ssw_Sml_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  void *pvVar2;
  uint *Entry;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vSimInfo;
  Ssw_Sml_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p->pAig);
  p_00 = Vec_PtrStart(iVar1);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), local_24 < iVar1; local_24 = local_24 + 1)
  {
    pvVar2 = Vec_PtrEntry(p->pAig->vObjs,local_24);
    if (pvVar2 != (void *)0x0) {
      Entry = Ssw_ObjSim(p,local_24);
      Vec_PtrWriteEntry(p_00,local_24,Entry);
    }
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Ssw_SmlSimDataPointers( Ssw_Sml_t * p )
{
    Vec_Ptr_t * vSimInfo;
    Aig_Obj_t * pObj;
    int i;
    vSimInfo = Vec_PtrStart( Aig_ManObjNumMax(p->pAig) );
    Aig_ManForEachObj( p->pAig, pObj, i )
        Vec_PtrWriteEntry( vSimInfo, i, Ssw_ObjSim(p, i) );
    return vSimInfo;
}